

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

ProgramSources *
deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::genShaderSources
          (ProgramSources *__return_storage_ptr__,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          *uniformList)

{
  int iVar1;
  bool bVar2;
  DataType DVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference this;
  size_type sVar6;
  TypeComponentVector *pTVar7;
  int precision;
  VarType *type;
  VarType *type_00;
  float val;
  DeclareStructTypePtr DVar8;
  pair<std::_Rb_tree_const_iterator<const_glu::StructType_*>,_bool> pVar9;
  int local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  SubTypeIterator<glu::IsBasicType> local_950;
  string local_930;
  TypeAccessFormat local_910;
  string local_900;
  TypeAccessFormat local_8e0;
  TypeAccessFormat local_8d0;
  TypeAccessFormat local_8c0;
  undefined1 local_8b0 [8];
  string expectValue;
  char *typeName;
  undefined1 local_880 [4];
  DataType scalarType;
  VarType subType;
  undefined1 local_848 [8];
  BasicTypeIterator subTypeIter;
  allocator<char> local_7e1;
  string local_7e0 [32];
  DeclareVariable local_7c0;
  byte local_77a;
  allocator<char> local_779;
  string local_778 [32];
  _Base_ptr local_758;
  undefined1 local_750;
  StructType *local_748;
  int local_740;
  DeclareStructTypePtr local_738;
  StructType *local_728;
  int local_720;
  DeclareStructTypePtr local_718;
  StructType *local_708;
  StructType *structType;
  int subTypeIndex;
  int location;
  undefined1 local_6d8 [8];
  string uniName;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  undefined1 local_670 [8];
  string layout;
  bool checkInFrag;
  bool checkInVert;
  bool layoutInFrag;
  bool layoutInVert;
  bool declareInFrag;
  bool declareInVert;
  UniformInfo *uniformInfo;
  undefined1 local_638 [4];
  int uniformNdx;
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  declaredStructs;
  ostringstream fragMain;
  ostringstream local_490 [8];
  ostringstream fragDecl;
  ostringstream local_308 [8];
  ostringstream vertMain;
  ostringstream local_190 [8];
  ostringstream vertDecl;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  *uniformList_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  std::__cxx11::ostringstream::ostringstream(local_490);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&declaredStructs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  poVar4 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar4 = std::operator<<(poVar4,"precision highp float;\n");
  poVar4 = std::operator<<(poVar4,"precision highp int;\n");
  poVar4 = std::operator<<(poVar4,
                           "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n"
                          );
  poVar4 = std::operator<<(poVar4,"in highp vec4 a_position;\n");
  std::operator<<(poVar4,"out highp vec4 v_color;\n");
  poVar4 = std::operator<<((ostream *)local_490,"#version 310 es\n\n");
  poVar4 = std::operator<<(poVar4,"precision highp float;\n");
  poVar4 = std::operator<<(poVar4,"precision highp int;\n");
  poVar4 = std::operator<<(poVar4,
                           "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n"
                          );
  poVar4 = std::operator<<(poVar4,"in highp vec4 v_color;\n");
  std::operator<<(poVar4,"layout(location = 0) out mediump vec4 o_color;\n\n");
  poVar4 = std::operator<<((ostream *)local_308,"void main()\n{\n");
  poVar4 = std::operator<<(poVar4,"\tgl_Position = a_position;\n");
  std::operator<<(poVar4,"\tv_color = vec4(1.0);\n");
  poVar4 = std::operator<<((ostream *)
                           &declaredStructs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           "void main()\n{\n");
  std::operator<<(poVar4,"\to_color = v_color;\n");
  std::
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::set((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
         *)local_638);
  for (uniformInfo._4_4_ = 0; iVar1 = uniformInfo._4_4_,
      sVar5 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ::size(uniformList), iVar1 < (int)sVar5; uniformInfo._4_4_ = uniformInfo._4_4_ + 1) {
    this = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
           ::operator[](uniformList,(long)uniformInfo._4_4_);
    layout.field_2._M_local_buf[0xf] =
         (this->declareLocation & SHADERSTAGE_VERTEX) != SHADERSTAGE_NONE;
    layout.field_2._M_local_buf[0xe] =
         (this->declareLocation & SHADERSTAGE_FRAGMENT) != SHADERSTAGE_NONE;
    layout.field_2._M_local_buf[0xd] =
         (this->layoutLocation & SHADERSTAGE_VERTEX) != SHADERSTAGE_NONE;
    layout.field_2._M_local_buf[0xc] =
         (this->layoutLocation & SHADERSTAGE_FRAGMENT) != SHADERSTAGE_NONE;
    layout.field_2._M_local_buf[0xb] =
         (this->checkLocation & SHADERSTAGE_VERTEX) != SHADERSTAGE_NONE;
    layout.field_2._M_local_buf[10] =
         (this->checkLocation & SHADERSTAGE_FRAGMENT) != SHADERSTAGE_NONE;
    uniName.field_2._M_local_buf[0xf] = '\0';
    uniName.field_2._M_local_buf[0xe] = '\0';
    uniName.field_2._M_local_buf[0xc] = '\0';
    if (this->location < 0) {
      std::allocator<char>::allocator();
      uniName.field_2._M_local_buf[0xc] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_670,"",(allocator<char> *)(uniName.field_2._M_local_buf + 0xd));
    }
    else {
      de::toString<int>(&local_6b0,&this->location);
      uniName.field_2._M_local_buf[0xf] = '\x01';
      std::operator+(&local_690,"layout(location = ",&local_6b0);
      uniName.field_2._M_local_buf[0xe] = '\x01';
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670,
                     &local_690,") ");
    }
    if ((uniName.field_2._M_local_buf[0xc] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(uniName.field_2._M_local_buf + 0xd));
    }
    if ((uniName.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_690);
    }
    if ((uniName.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_6b0);
    }
    de::toString<int>((string *)&subTypeIndex,(int *)((long)&uniformInfo + 4));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d8,
                   "uni",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &subTypeIndex);
    std::__cxx11::string::~string((string *)&subTypeIndex);
    structType._4_4_ = this->location;
    structType._0_4_ = 0;
    bVar2 = glu::VarType::isStructType(&this->type);
    if (bVar2) {
      local_708 = glu::VarType::getStructPtr(&this->type);
      sVar6 = std::
              set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
              ::count((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                       *)local_638,&local_708);
      if (sVar6 == 0) {
        if ((layout.field_2._M_local_buf[0xf] & 1U) != 0) {
          DVar8 = glu::declare(local_708,0);
          local_728 = DVar8.structPtr;
          local_720 = DVar8.indentLevel;
          local_718.structPtr = local_728;
          local_718.indentLevel = local_720;
          poVar4 = glu::decl::operator<<((ostream *)local_190,&local_718);
          std::operator<<(poVar4,";\n");
        }
        if ((layout.field_2._M_local_buf[0xe] & 1U) != 0) {
          DVar8 = glu::declare(local_708,0);
          local_748 = DVar8.structPtr;
          local_740 = DVar8.indentLevel;
          local_738.structPtr = local_748;
          local_738.indentLevel = local_740;
          poVar4 = glu::decl::operator<<((ostream *)local_490,&local_738);
          std::operator<<(poVar4,";\n");
        }
        pVar9 = std::
                set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                ::insert((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                          *)local_638,&local_708);
        local_758 = (_Base_ptr)pVar9.first._M_node;
        local_750 = pVar9.second;
      }
    }
    if ((layout.field_2._M_local_buf[0xf] & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)local_190,"uniform ");
      local_77a = 0;
      if ((layout.field_2._M_local_buf[0xd] & 1U) == 0) {
        std::allocator<char>::allocator();
        local_77a = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_778,"",&local_779);
      }
      else {
        std::__cxx11::string::string(local_778,(string *)local_670);
      }
      poVar4 = std::operator<<(poVar4,local_778);
      glu::declare(&local_7c0,&this->type,(string *)local_6d8,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_7c0);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_7c0);
      std::__cxx11::string::~string(local_778);
      if ((local_77a & 1) != 0) {
        std::allocator<char>::~allocator(&local_779);
      }
    }
    if ((layout.field_2._M_local_buf[0xe] & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)local_490,"uniform ");
      bVar2 = (layout.field_2._M_local_buf[0xc] & 1U) == 0;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_7e0,"",&local_7e1);
      }
      else {
        std::__cxx11::string::string(local_7e0,(string *)local_670);
      }
      poVar4 = std::operator<<(poVar4,local_7e0);
      glu::declare((DeclareVariable *)
                   &subTypeIter.m_path.
                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->type,
                   (string *)local_6d8,0);
      poVar4 = glu::decl::operator<<
                         (poVar4,(DeclareVariable *)
                                 &subTypeIter.m_path.
                                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable
                ((DeclareVariable *)
                 &subTypeIter.m_path.
                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string(local_7e0);
      if (bVar2) {
        std::allocator<char>::~allocator(&local_7e1);
      }
    }
    glu::SubTypeIterator<glu::IsBasicType>::begin
              ((SubTypeIterator<glu::IsBasicType> *)local_848,&this->type);
    while( true ) {
      glu::SubTypeIterator<glu::IsBasicType>::end
                ((SubTypeIterator<glu::IsBasicType> *)((long)&subType.m_data + 8),&this->type);
      bVar2 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                        ((SubTypeIterator<glu::IsBasicType> *)local_848,
                         (SubTypeIterator<glu::IsBasicType> *)((long)&subType.m_data + 8));
      glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                ((SubTypeIterator<glu::IsBasicType> *)((long)&subType.m_data + 8));
      if (!bVar2) break;
      pTVar7 = glu::SubTypeIterator<glu::IsBasicType>::getPath
                         ((SubTypeIterator<glu::IsBasicType> *)local_848);
      glu::getVarType((VarType *)local_880,&this->type,pTVar7);
      DVar3 = glu::VarType::getBasicType((VarType *)local_880);
      DVar3 = glu::getDataTypeScalarType(DVar3);
      expectValue.field_2._8_8_ = glu::getDataTypeName(DVar3);
      if (structType._4_4_ < 0) {
        local_b60 = -1;
      }
      else {
        local_b60 = structType._4_4_ + (int)structType;
      }
      val = getExpectedValue(DVar3,local_b60,(char *)expectValue.field_2._8_8_);
      de::floatToString_abi_cxx11_((string *)local_8b0,(de *)0x3,val,precision);
      bVar2 = glu::isDataTypeSampler(DVar3);
      if (bVar2) {
        if ((layout.field_2._M_local_buf[0xb] & 1U) != 0) {
          poVar4 = std::operator<<((ostream *)local_308,"\tv_color.rgb *= verify(float( texture(");
          poVar4 = std::operator<<(poVar4,(string *)local_6d8);
          pTVar7 = glu::SubTypeIterator<glu::IsBasicType>::getPath
                             ((SubTypeIterator<glu::IsBasicType> *)local_848);
          glu::TypeAccessFormat::TypeAccessFormat(&local_8c0,&this->type,pTVar7);
          poVar4 = glu::operator<<(poVar4,&local_8c0);
          poVar4 = std::operator<<(poVar4,", vec2(0.5)).r), ");
          poVar4 = std::operator<<(poVar4,(string *)local_8b0);
          std::operator<<(poVar4,");\n");
        }
        if ((layout.field_2._M_local_buf[10] & 1U) != 0) {
          poVar4 = std::operator<<((ostream *)
                                   &declaredStructs._M_t._M_impl.super__Rb_tree_header._M_node_count
                                   ,"\to_color.rgb *= verify(float( texture(");
          poVar4 = std::operator<<(poVar4,(string *)local_6d8);
          pTVar7 = glu::SubTypeIterator<glu::IsBasicType>::getPath
                             ((SubTypeIterator<glu::IsBasicType> *)local_848);
          glu::TypeAccessFormat::TypeAccessFormat(&local_8d0,&this->type,pTVar7);
          poVar4 = glu::operator<<(poVar4,&local_8d0);
          poVar4 = std::operator<<(poVar4,", vec2(0.5)).r), ");
          poVar4 = std::operator<<(poVar4,(string *)local_8b0);
          std::operator<<(poVar4,");\n");
        }
      }
      else {
        if ((layout.field_2._M_local_buf[0xb] & 1U) != 0) {
          poVar4 = std::operator<<((ostream *)local_308,"\tv_color.rgb *= verify(float(");
          poVar4 = std::operator<<(poVar4,(string *)local_6d8);
          pTVar7 = glu::SubTypeIterator<glu::IsBasicType>::getPath
                             ((SubTypeIterator<glu::IsBasicType> *)local_848);
          glu::TypeAccessFormat::TypeAccessFormat(&local_8e0,&this->type,pTVar7);
          poVar4 = glu::operator<<(poVar4,&local_8e0);
          (anonymous_namespace)::getFirstComponentName_abi_cxx11_
                    (&local_900,(_anonymous_namespace_ *)local_880,type);
          poVar4 = std::operator<<(poVar4,(string *)&local_900);
          poVar4 = std::operator<<(poVar4,"), ");
          poVar4 = std::operator<<(poVar4,(string *)local_8b0);
          std::operator<<(poVar4,");\n");
          std::__cxx11::string::~string((string *)&local_900);
        }
        if ((layout.field_2._M_local_buf[10] & 1U) != 0) {
          poVar4 = std::operator<<((ostream *)
                                   &declaredStructs._M_t._M_impl.super__Rb_tree_header._M_node_count
                                   ,"\to_color.rgb *= verify(float(");
          poVar4 = std::operator<<(poVar4,(string *)local_6d8);
          pTVar7 = glu::SubTypeIterator<glu::IsBasicType>::getPath
                             ((SubTypeIterator<glu::IsBasicType> *)local_848);
          glu::TypeAccessFormat::TypeAccessFormat(&local_910,&this->type,pTVar7);
          poVar4 = glu::operator<<(poVar4,&local_910);
          (anonymous_namespace)::getFirstComponentName_abi_cxx11_
                    (&local_930,(_anonymous_namespace_ *)local_880,type_00);
          poVar4 = std::operator<<(poVar4,(string *)&local_930);
          poVar4 = std::operator<<(poVar4,"), ");
          poVar4 = std::operator<<(poVar4,(string *)local_8b0);
          std::operator<<(poVar4,");\n");
          std::__cxx11::string::~string((string *)&local_930);
        }
      }
      std::__cxx11::string::~string((string *)local_8b0);
      glu::VarType::~VarType((VarType *)local_880);
      glu::SubTypeIterator<glu::IsBasicType>::operator++
                (&local_950,(SubTypeIterator<glu::IsBasicType> *)local_848,0);
      structType._0_4_ = (int)structType + 1;
      glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator(&local_950);
    }
    glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
              ((SubTypeIterator<glu::IsBasicType> *)local_848);
    std::__cxx11::string::~string((string *)local_6d8);
    std::__cxx11::string::~string((string *)local_670);
  }
  std::operator<<((ostream *)local_308,"}\n");
  std::operator<<((ostream *)&declaredStructs._M_t._M_impl.super__Rb_tree_header._M_node_count,"}\n"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  std::operator+(&local_970,&local_990,&local_9b0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  std::operator+(&local_9d0,&local_9f0,&local_a10);
  glu::makeVtxFragSources(__return_storage_ptr__,&local_970,&local_9d0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_990);
  std::
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::~set((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
          *)local_638);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&declaredStructs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::ostringstream::~ostringstream(local_490);
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

glu::ProgramSources UniformLocationCase::genShaderSources (const vector<UniformInfo>& uniformList)
{
	std::ostringstream	vertDecl, vertMain, fragDecl, fragMain;

	vertDecl << "#version 310 es\n"
			 << "precision highp float;\n"
			 << "precision highp int;\n"
			 << "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n"
			 << "in highp vec4 a_position;\n"
			 << "out highp vec4 v_color;\n";
	fragDecl << "#version 310 es\n\n"
			 << "precision highp float;\n"
			 << "precision highp int;\n"
			 << "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n"
			 << "in highp vec4 v_color;\n"
			 << "layout(location = 0) out mediump vec4 o_color;\n\n";

	vertMain << "void main()\n{\n"
			 << "	gl_Position = a_position;\n"
			 << "	v_color = vec4(1.0);\n";

	fragMain << "void main()\n{\n"
			 << "	o_color = v_color;\n";

	std::set<const glu::StructType*> declaredStructs;

	// Declare uniforms
	for (int uniformNdx = 0; uniformNdx < int(uniformList.size()); uniformNdx++)
	{
		const UniformInfo&	uniformInfo = uniformList[uniformNdx];

		const bool			declareInVert	= (uniformInfo.declareLocation & UniformInfo::SHADERSTAGE_VERTEX)   != 0;
		const bool			declareInFrag	= (uniformInfo.declareLocation & UniformInfo::SHADERSTAGE_FRAGMENT) != 0;
		const bool			layoutInVert    = (uniformInfo.layoutLocation  & UniformInfo::SHADERSTAGE_VERTEX)   != 0;
		const bool			layoutInFrag    = (uniformInfo.layoutLocation  & UniformInfo::SHADERSTAGE_FRAGMENT) != 0;
		const bool			checkInVert		= (uniformInfo.checkLocation   & UniformInfo::SHADERSTAGE_VERTEX)   != 0;
		const bool			checkInFrag		= (uniformInfo.checkLocation   & UniformInfo::SHADERSTAGE_FRAGMENT) != 0;

		const string		layout			= uniformInfo.location >= 0 ? "layout(location = " + de::toString(uniformInfo.location) + ") " : "";
		const string		uniName			= "uni" + de::toString(uniformNdx);

		int					location		= uniformInfo.location;
		int					subTypeIndex	= 0;

		DE_ASSERT((declareInVert && layoutInVert) || !layoutInVert); // Cannot have layout without declaration
		DE_ASSERT((declareInFrag && layoutInFrag) || !layoutInFrag);
		DE_ASSERT(location<0 || (layoutInVert || layoutInFrag)); // Cannot have location without layout

		// struct definitions
		if (uniformInfo.type.isStructType())
		{
			const glu::StructType* const structType = uniformInfo.type.getStructPtr();
			if (!declaredStructs.count(structType))
			{
				if (declareInVert)
					vertDecl << glu::declare(structType, 0) << ";\n";

				if (declareInFrag)
					fragDecl << glu::declare(structType, 0) << ";\n";

				declaredStructs.insert(structType);
			}
		}

		if (declareInVert)
			vertDecl << "uniform " << (layoutInVert ? layout : "") << glu::declare(uniformInfo.type, uniName) << ";\n";

		if (declareInFrag)
			fragDecl << "uniform " << (layoutInFrag ? layout : "") << glu::declare(uniformInfo.type, uniName) << ";\n";

		// Anything that needs to be done for each enclosed primitive type
		for (glu::BasicTypeIterator subTypeIter = glu::BasicTypeIterator::begin(&uniformInfo.type); subTypeIter != glu::BasicTypeIterator::end(&uniformInfo.type); subTypeIter++, subTypeIndex++)
		{
			const glu::VarType	subType		= glu::getVarType(uniformInfo.type, subTypeIter.getPath());
			const glu::DataType	scalarType	= glu::getDataTypeScalarType(subType.getBasicType());
			const char* const	typeName	= glu::getDataTypeName(scalarType);
			const string		expectValue	= de::floatToString(getExpectedValue(scalarType, location >= 0 ? location+subTypeIndex : -1, typeName), 3);

			if (glu::isDataTypeSampler(scalarType))
			{
				if (checkInVert)
					vertMain << "	v_color.rgb *= verify(float( texture(" << uniName
							 << glu::TypeAccessFormat(uniformInfo.type, subTypeIter.getPath())
							 << ", vec2(0.5)).r), " << expectValue << ");\n";
				if (checkInFrag)
					fragMain << "	o_color.rgb *= verify(float( texture(" << uniName
							 << glu::TypeAccessFormat(uniformInfo.type, subTypeIter.getPath())
							 << ", vec2(0.5)).r), " << expectValue << ");\n";
			}
			else
			{
				if (checkInVert)
					vertMain << "	v_color.rgb *= verify(float(" << uniName
							 << glu::TypeAccessFormat(uniformInfo.type, subTypeIter.getPath())
							 << getFirstComponentName(subType) << "), " << expectValue << ");\n";
				if (checkInFrag)
					fragMain << "	o_color.rgb *= verify(float(" << uniName
							 << glu::TypeAccessFormat(uniformInfo.type, subTypeIter.getPath())
							 << getFirstComponentName(subType) << "), " << expectValue << ");\n";
			}
		}
	}

	vertMain << "}\n";
	fragMain << "}\n";

	return glu::makeVtxFragSources(vertDecl.str() + vertMain.str(), fragDecl.str() + fragMain.str());
}